

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void lua_replace(lua_State *L,int idx)

{
  StkId pTVar1;
  undefined1 uVar2;
  undefined2 uVar3;
  GCObject *pGVar4;
  int in_ESI;
  lua_State *in_RDI;
  TValue *o1;
  TValue *o2;
  Closure *func;
  StkId o;
  GCObject *in_stack_ffffffffffffffd0;
  GCObject *in_stack_ffffffffffffffd8;
  lua_State *in_stack_ffffffffffffffe0;
  
  if ((in_ESI == -0x2711) && (in_RDI->ci == in_RDI->base_ci)) {
    luaG_runerror(in_RDI,"no calling environment");
  }
  pGVar4 = (GCObject *)index2adr(in_RDI,in_ESI);
  if (in_ESI == -0x2711) {
    pGVar4 = (in_RDI->ci->func->value).gc;
    (pGVar4->h).array = (TValue *)in_RDI->top[-1].value;
    if (((3 < in_RDI->top[-1].tt) && ((((in_RDI->top[-1].value.gc)->gch).marked & 3) != 0)) &&
       (((pGVar4->gch).marked & 4) != 0)) {
      luaC_barrierf(&pGVar4->th,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    }
  }
  else {
    pTVar1 = in_RDI->top;
    (pGVar4->gch).next = (((GCObject *)(pTVar1 + -1))->gch).next;
    uVar2 = *(undefined1 *)((long)&pTVar1[-1].tt + 1);
    uVar3 = *(undefined2 *)((long)&pTVar1[-1].tt + 2);
    *(undefined1 *)((long)pGVar4 + 8) = *(undefined1 *)&pTVar1[-1].tt;
    *(undefined1 *)((long)pGVar4 + 9) = uVar2;
    *(undefined2 *)((long)pGVar4 + 10) = uVar3;
    if ((((in_ESI < -0x2712) && (3 < in_RDI->top[-1].tt)) &&
        ((((in_RDI->top[-1].value.gc)->gch).marked & 3) != 0)) &&
       (((((in_RDI->ci->func->value).gc)->gch).marked & 4) != 0)) {
      luaC_barrierf(in_stack_ffffffffffffffe0,(GCObject *)(pTVar1 + -1),pGVar4);
    }
  }
  in_RDI->top = in_RDI->top + -1;
  return;
}

Assistant:

static void lua_replace(lua_State*L,int idx){
StkId o;
if(idx==(-10001)&&L->ci==L->base_ci)
luaG_runerror(L,"no calling environment");
api_checknelems(L,1);
o=index2adr(L,idx);
api_checkvalidindex(L,o);
if(idx==(-10001)){
Closure*func=curr_func(L);
luai_apicheck(L,ttistable(L->top-1));
func->c.env=hvalue(L->top-1);
luaC_barrier(L,func,L->top-1);
}
else{
setobj(L,o,L->top-1);
if(idx<(-10002))
luaC_barrier(L,curr_func(L),L->top-1);
}
L->top--;
}